

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlAttrValueSpec::PrettyPrint
          (GdlAttrValueSpec *this,GrcManager *pcman,ostream *strmOut,bool fXml,bool *param_4,
          bool *param_5,bool *param_6,size_t param_7)

{
  ostream *poVar1;
  string local_50;
  
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,this->m_psymName);
  std::operator<<(strmOut,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<(strmOut," ");
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(&local_50,this->m_psymOperator);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&local_50);
  (*this->m_pexpValue->_vptr_GdlExpression[0x1d])(this->m_pexpValue,pcman,strmOut,(ulong)fXml,0);
  std::operator<<(strmOut,"; ");
  return;
}

Assistant:

void GdlAttrValueSpec::PrettyPrint(GrcManager * pcman, std::ostream & strmOut, bool fXml,
	bool * /*pfAtt*/, bool * /*pfAttAt*/, bool * /*pfAttWith*/, size_t /*cpavs*/)
{
	strmOut << m_psymName->FullAbbrev();
	strmOut << " " << m_psymOperator->FullAbbrev() << " ";
	m_pexpValue->PrettyPrint(pcman, strmOut, fXml);
	strmOut << "; ";
}